

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fthash.c
# Opt level: O0

FT_ULong hash_str_lookup(FT_Hashkey *key)

{
  undefined8 local_20;
  FT_ULong res;
  char *kp;
  FT_Hashkey *key_local;
  
  res = *(FT_ULong *)key;
  local_20 = 0;
  for (; *(char *)res != '\0'; res = res + 1) {
    local_20 = local_20 * 0x1f + (long)*(char *)res;
  }
  return local_20;
}

Assistant:

static FT_ULong
  hash_str_lookup( FT_Hashkey*  key )
  {
    const char*  kp  = key->str;
    FT_ULong     res = 0;


    /* Mocklisp hash function. */
    while ( *kp )
      res = ( res << 5 ) - res + (FT_ULong)*kp++;

    return res;
  }